

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_hq.cpp
# Opt level: O1

size_t duckdb_brotli::BrotliZopfliComputeShortestPath
                 (MemoryManager *m,size_t num_bytes,size_t position,uint8_t *ringbuffer,
                 size_t ringbuffer_mask,ContextLut literal_context_lut,BrotliEncoderParams *params,
                 int *dist_cache,Hasher *hasher,ZopfliNode *nodes)

{
  BackwardMatch *src2;
  uint8_t *puVar1;
  ulong max_backward_limit;
  byte bVar2;
  uint uVar3;
  size_t gap;
  BrotliEncoderDictionary *dictionary;
  uint32_t *puVar4;
  void *pvVar5;
  ulong uVar6;
  PreparedDictionary *pPVar7;
  size_t sVar8;
  ulong uVar9;
  byte bVar10;
  ulong uVar11;
  undefined1 auVar12 [16];
  byte bVar13;
  int iVar14;
  uint8_t *s1_orig_1;
  BackwardMatch *dst;
  ZopfliCostModel *self;
  long lVar15;
  ulong uVar16;
  size_t sVar17;
  size_t sVar18;
  uint uVar19;
  uint uVar20;
  long lVar21;
  size_t sVar22;
  ulong uVar23;
  ulong *puVar24;
  long lVar25;
  undefined8 *puVar26;
  ulong *puVar27;
  size_t sVar28;
  BackwardMatch *pBVar29;
  uint8_t *s1_orig_3;
  ulong uVar30;
  size_t len2;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  uint8_t *puVar34;
  ulong *puVar35;
  uint8_t *puVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  ulong *puVar41;
  ulong *puVar42;
  size_t min_length;
  ulong uVar43;
  long lVar44;
  uint8_t *s1_orig_2;
  long lVar45;
  size_t len1;
  ulong uVar46;
  uint *puVar47;
  bool bVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  uint8_t *local_2f8;
  uint8_t *local_2d8;
  uint8_t *local_2c0;
  ulong local_2b8;
  size_t total_found;
  BackwardMatch *local_290;
  ulong local_288;
  size_t local_280;
  BackwardMatch *orig_matches;
  undefined8 local_1e8;
  ulong local_1e0;
  uint32_t dict_matches [38];
  StartPosQueue queue;
  
  iVar14 = params->lgwin;
  sVar18 = params->stream_offset;
  uVar19 = 0x145;
  if (params->quality < 0xb) {
    uVar19 = 0x96;
  }
  dst = (BackwardMatch *)BrotliAllocate(m,0xc00);
  lVar21 = 0;
  if (0x7e < num_bytes) {
    lVar21 = num_bytes - 0x7f;
  }
  sVar22 = (params->dictionary).compound.num_chunks;
  gap = (params->dictionary).compound.total_size;
  self = (ZopfliCostModel *)BrotliAllocate(m,0x26a8);
  nodes->length = 0;
  (nodes->u).cost = 0.0;
  InitZopfliCostModel(m,self,&params->dist,num_bytes);
  ZopfliCostModelSetFromLiteralCosts(self,position,ringbuffer,ringbuffer_mask);
  queue.idx_ = 0;
  if (3 < num_bytes) {
    max_backward_limit = (1L << ((byte)iVar14 & 0x3f)) - 0x10;
    uVar11 = (ulong)(sVar22 != 0);
    src2 = dst + uVar11 * 0x100;
    local_1e8 = sVar18 + position;
    sVar22 = 0;
    min_length = position;
    do {
      auVar12 = _DAT_003bd370;
      uVar31 = sVar22 + position;
      uVar16 = max_backward_limit;
      if (uVar31 < max_backward_limit) {
        uVar16 = uVar31;
      }
      uVar33 = uVar31 + sVar18;
      if (max_backward_limit <= uVar33) {
        uVar33 = max_backward_limit;
      }
      if ((params->dictionary).contextual.context_based == 0) {
        uVar23 = 0;
      }
      else {
        if (uVar31 == 0) {
          uVar23 = 0;
        }
        else {
          uVar23 = (ulong)ringbuffer[uVar31 - 1 & ringbuffer_mask];
        }
        if (uVar31 < 2) {
          uVar30 = 0;
        }
        else {
          uVar30 = (ulong)ringbuffer[uVar31 - 2 & ringbuffer_mask];
        }
        uVar23 = (ulong)(params->dictionary).contextual.context_map
                        [literal_context_lut[uVar30 + 0x100] | literal_context_lut[uVar23]];
      }
      dictionary = (params->dictionary).contextual.dict[uVar23];
      uVar30 = num_bytes - sVar22;
      uVar37 = uVar31 & ringbuffer_mask;
      uVar23 = 0x10;
      if (params->quality == 0xb) {
        uVar23 = 0x40;
      }
      uVar40 = 0;
      if (uVar23 <= uVar31) {
        uVar40 = uVar31 - uVar23;
      }
      puVar35 = (ulong *)(ringbuffer + uVar37);
      uVar39 = 1;
      uVar23 = uVar31;
      total_found = (size_t)src2;
      do {
        uVar23 = uVar23 - 1;
        if ((uVar23 <= uVar40) || (2 < uVar39)) break;
        uVar38 = uVar31 - uVar23;
        if ((uVar38 <= uVar16) &&
           (((uint8_t)*puVar35 == ringbuffer[uVar23 & ringbuffer_mask] &&
            (puVar41 = (ulong *)(ringbuffer + (uVar23 & ringbuffer_mask)), uVar32 = uVar30,
            puVar24 = puVar35, puVar42 = puVar41,
            *(char *)((long)puVar35 + 1) == *(char *)((long)puVar41 + 1))))) {
          for (; 7 < uVar32; uVar32 = uVar32 - 8) {
            uVar46 = *puVar24;
            uVar43 = *puVar42;
            if (uVar46 == uVar43) {
              puVar42 = puVar42 + 1;
            }
            else {
              uVar6 = 0;
              if ((uVar43 ^ uVar46) != 0) {
                for (; ((uVar43 ^ uVar46) >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
                }
              }
              min_length = (long)puVar42 + ((uVar6 >> 3 & 0x1fffffff) - (long)puVar41);
            }
            if (uVar46 != uVar43) goto LAB_002ea226;
            puVar24 = puVar24 + 1;
          }
          if (uVar32 != 0) {
            uVar46 = 0;
            do {
              uVar43 = uVar46;
              if (*(char *)((long)puVar42 + uVar46) != *(char *)((long)puVar24 + uVar46)) break;
              uVar46 = uVar46 + 1;
              uVar43 = uVar32;
            } while (uVar32 != uVar46);
            puVar42 = (ulong *)((long)puVar42 + uVar43);
          }
          min_length = (long)puVar42 - (long)puVar41;
LAB_002ea226:
          if (uVar39 < min_length) {
            *(int *)total_found = (int)uVar38;
            *(int *)(total_found + 4) = (int)min_length << 5;
            total_found = total_found + 8;
            uVar39 = min_length;
          }
        }
        min_length = uVar39;
      } while (uVar38 <= uVar16);
      if (uVar39 < uVar30) {
        uVar20 = (uint)(*(int *)(ringbuffer + uVar37) * 0x1e35a7bd) >> 0xf;
        uVar23 = (hasher->privat)._H5.bucket_size_;
        puVar4 = (hasher->privat)._H2.buckets_;
        pvVar5 = (hasher->privat)._H40.extra[1];
        uVar38 = (ulong)puVar4[uVar20];
        uVar40 = uVar30;
        if (0x7f < uVar30) {
          puVar4[uVar20] = (uint32_t)uVar31;
          uVar40 = 0x80;
        }
        lVar15 = (uVar23 & uVar31) * 2 + 1;
        lVar44 = (uVar23 & uVar31) * 2;
        lVar45 = 0x40;
        local_2b8 = 0;
        local_290 = (BackwardMatch *)0x0;
        do {
          uVar32 = uVar31 - uVar38;
          if ((uVar32 == 0) || (lVar45 == 0 || uVar16 < uVar32)) {
            if (0x7f < uVar30) {
              *(int *)((long)pvVar5 + lVar44 * 4) = (hasher->privat)._H5.hash_shift_;
              *(int *)((long)pvVar5 + lVar15 * 4) = (hasher->privat)._H5.hash_shift_;
            }
            bVar48 = false;
          }
          else {
            pBVar29 = local_290;
            if (local_2b8 < local_290) {
              pBVar29 = (BackwardMatch *)local_2b8;
            }
            puVar42 = (ulong *)(ringbuffer + (long)pBVar29 + uVar37);
            puVar35 = (ulong *)(ringbuffer + (long)pBVar29 + (uVar38 & ringbuffer_mask));
            puVar24 = puVar42;
            lVar25 = lVar15;
            for (uVar46 = uVar30 - (long)pBVar29; 7 < uVar46; uVar46 = uVar46 - 8) {
              uVar43 = *puVar35;
              uVar6 = *puVar24;
              if (uVar43 == uVar6) {
                puVar24 = puVar24 + 1;
              }
              else {
                uVar9 = 0;
                if ((uVar6 ^ uVar43) != 0) {
                  for (; ((uVar6 ^ uVar43) >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
                  }
                }
                lVar25 = (long)puVar24 + ((uVar9 >> 3 & 0x1fffffff) - (long)puVar42);
              }
              if (uVar43 != uVar6) goto LAB_002ea3ef;
              puVar35 = puVar35 + 1;
            }
            puVar41 = puVar24;
            if (uVar46 != 0) {
              puVar41 = (ulong *)((long)puVar24 + uVar46);
              uVar43 = 0;
              do {
                if (*(char *)((long)puVar24 + uVar43) != *(char *)((long)puVar35 + uVar43)) {
                  puVar41 = (ulong *)((long)puVar24 + uVar43);
                  break;
                }
                uVar43 = uVar43 + 1;
              } while (uVar46 != uVar43);
            }
            lVar25 = (long)puVar41 - (long)puVar42;
LAB_002ea3ef:
            uVar46 = lVar25 + (long)pBVar29;
            if (total_found == 0) {
              total_found = 0;
            }
            else if (uVar39 < uVar46) {
              *(int *)total_found = (int)uVar32;
              *(int *)(total_found + 4) = (int)uVar46 << 5;
              total_found = total_found + 8;
              uVar39 = uVar46;
            }
            if (uVar46 < uVar40) {
              if (ringbuffer[uVar46 + (uVar38 & ringbuffer_mask)] < ringbuffer[uVar46 + uVar37]) {
                if (0x7f < uVar30) {
                  *(int *)((long)pvVar5 + lVar44 * 4) = (int)uVar38;
                }
                lVar25 = (uVar38 & uVar23) * 2 + 1;
                lVar44 = lVar25;
                local_2b8 = uVar46;
              }
              else {
                if (0x7f < uVar30) {
                  *(int *)((long)pvVar5 + lVar15 * 4) = (int)uVar38;
                }
                lVar25 = (uVar38 & uVar23) * 2;
                lVar15 = lVar25;
                local_290 = (BackwardMatch *)uVar46;
              }
              uVar38 = (ulong)*(uint *)((long)pvVar5 + lVar25 * 4);
              bVar48 = true;
            }
            else if (uVar30 < 0x80) {
              bVar48 = false;
            }
            else {
              *(undefined4 *)((long)pvVar5 + lVar44 * 4) =
                   *(undefined4 *)((long)pvVar5 + (uVar38 & uVar23) * 8);
              *(undefined4 *)((long)pvVar5 + lVar15 * 4) =
                   *(undefined4 *)((long)pvVar5 + (uVar38 & uVar23) * 8 + 4);
              bVar48 = false;
            }
          }
          lVar45 = lVar45 + -1;
        } while (bVar48);
      }
      lVar15 = 3;
      auVar49 = _DAT_003bd360;
      auVar50 = _DAT_003bd350;
      do {
        auVar51 = auVar49 ^ auVar12;
        if (auVar51._4_4_ == -0x80000000 && auVar51._0_4_ < -0x7fffffda) {
          *(undefined4 *)((long)&local_1e8 + lVar15 * 4 + 4) = 0xfffffff;
          dict_matches[lVar15 + -2] = 0xfffffff;
        }
        auVar51 = auVar50 ^ auVar12;
        if (auVar51._4_4_ == -0x80000000 && auVar51._0_4_ < -0x7fffffda) {
          dict_matches[lVar15 + -1] = 0xfffffff;
          dict_matches[lVar15] = 0xfffffff;
        }
        lVar44 = auVar49._8_8_;
        auVar49._0_8_ = auVar49._0_8_ + 4;
        auVar49._8_8_ = lVar44 + 4;
        lVar44 = auVar50._8_8_;
        auVar50._0_8_ = auVar50._0_8_ + 4;
        auVar50._8_8_ = lVar44 + 4;
        lVar15 = lVar15 + 4;
      } while (lVar15 != 0x2b);
      min_length = uVar39 + 1;
      if (min_length < 5) {
        min_length = 4;
      }
      puVar35 = (ulong *)(ringbuffer + uVar37);
      iVar14 = BrotliFindAllStaticDictionaryMatches
                         (dictionary,(uint8_t *)puVar35,min_length,uVar30,dict_matches);
      if (iVar14 != 0) {
        uVar16 = 0x25;
        if (uVar30 < 0x25) {
          uVar16 = uVar30;
        }
        if (min_length <= uVar16) {
          iVar14 = (int)min_length << 5;
          do {
            uVar20 = dict_matches[min_length];
            if ((uVar20 < 0xfffffff) &&
               (uVar23 = (ulong)(uVar20 >> 5) + gap + 1 + uVar33,
               uVar23 <= (params->dist).max_distance)) {
              uVar20 = uVar20 & 0x1f;
              *(int *)total_found = (int)uVar23;
              if (min_length == uVar20) {
                uVar20 = 0;
              }
              *(uint *)(total_found + 4) = uVar20 + iVar14;
              total_found = total_found + 8;
            }
            min_length = min_length + 1;
            iVar14 = iVar14 + 0x20;
          } while (uVar16 + 1 != min_length);
        }
      }
      len2 = (long)(total_found - (long)src2) >> 3;
      sVar17 = (params->dictionary).compound.num_chunks;
      if (sVar17 != 0) {
        uVar16 = (params->dist).max_distance;
        uVar33 = uVar33 + (params->dictionary).compound.total_size;
        local_1e0 = *puVar35;
        local_288 = 3;
        len1 = 0;
        sVar28 = 0;
        do {
          pPVar7 = (params->dictionary).compound.chunks[sVar28];
          bVar2 = (byte)pPVar7->bucket_bits;
          bVar13 = (byte)pPVar7->slot_bits;
          bVar10 = -(char)pPVar7->hash_bits;
          uVar23 = ((local_1e0 << (bVar10 & 0x3f)) >> (bVar10 & 0x3f)) * 0x1fe35a7bd3579bd3 >>
                   (-bVar2 & 0x3f);
          lVar15 = (1L << (bVar13 & 0x3f)) * 4;
          lVar44 = (1L << (bVar2 & 0x3f)) * 2;
          bVar13 = -bVar13;
          uVar20 = (uint)*(ushort *)((long)&pPVar7[1].magic + (uVar23 & 0xffffffff) * 2 + lVar15);
          puVar26 = (undefined8 *)
                    ((long)&pPVar7[1].magic + (ulong)pPVar7->num_items * 4 + lVar44 + lVar15);
          if (pPVar7->magic != 0xdebcede0) {
            puVar26 = (undefined8 *)*puVar26;
          }
          sVar8 = (params->dictionary).compound.chunk_offsets[sVar28];
          local_290 = dst + uVar11 * 0x100 + -0x40 + len1;
          uVar3 = pPVar7->source_size;
          puVar47 = (uint *)((long)&pPVar7[1].magic +
                            (ulong)(uVar20 + (&pPVar7[1].magic)
                                             [(uint)((int)uVar23 << (bVar13 & 0x1f)) >>
                                              (bVar13 & 0x1f)]) * 4 + lVar44 + lVar15);
          min_length = (size_t)(uVar20 == 0xffff);
          local_2d8 = (uint8_t *)0x0;
          uVar23 = local_288;
          do {
            if ((int)min_length != 0) break;
            uVar20 = *puVar47;
            uVar39 = (ulong)(uVar20 & 0x7fffffff);
            uVar38 = (uVar33 - sVar8) - uVar39;
            uVar40 = uVar3 - uVar39;
            if (uVar30 <= uVar40) {
              uVar40 = uVar30;
            }
            if (uVar16 < uVar38) {
LAB_002ea7f2:
              bVar48 = false;
            }
            else {
              bVar48 = false;
              if ((uVar23 + uVar37 <= ringbuffer_mask) && (uVar23 < uVar40)) {
                if (ringbuffer[uVar23 + uVar37] != *(uint8_t *)((long)puVar26 + uVar23 + uVar39))
                goto LAB_002ea7f2;
                puVar41 = (ulong *)(uVar39 + (long)puVar26);
                puVar24 = puVar35;
                uVar39 = uVar33;
                puVar42 = puVar41;
                for (; 7 < uVar40; uVar40 = uVar40 - 8) {
                  uVar32 = *puVar24;
                  uVar46 = *puVar42;
                  if (uVar32 == uVar46) {
                    puVar42 = puVar42 + 1;
                  }
                  else {
                    uVar39 = 0;
                    if ((uVar46 ^ uVar32) != 0) {
                      for (; ((uVar46 ^ uVar32) >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                      }
                    }
                    uVar39 = (long)puVar42 + ((uVar39 >> 3 & 0x1fffffff) - (long)puVar41);
                  }
                  if (uVar32 != uVar46) goto LAB_002ea8bb;
                  puVar24 = puVar24 + 1;
                }
                puVar27 = puVar42;
                if (uVar40 != 0) {
                  puVar27 = (ulong *)((long)puVar42 + uVar40);
                  uVar39 = 0;
                  do {
                    if (*(char *)((long)puVar42 + uVar39) != *(char *)((long)puVar24 + uVar39)) {
                      puVar27 = (ulong *)((long)puVar42 + uVar39);
                      break;
                    }
                    uVar39 = uVar39 + 1;
                  } while (uVar40 != uVar39);
                }
                uVar39 = (long)puVar27 - (long)puVar41;
LAB_002ea8bb:
                if (uVar23 < uVar39) {
                  local_290->distance = (uint32_t)uVar38;
                  local_290->length_and_code = (int)uVar39 << 5;
                  local_290 = local_290 + 1;
                  local_2d8 = (uint8_t *)((long)local_2d8 + 1);
                  bVar48 = local_2d8 == (uint8_t *)(0x40 - len1);
                  uVar23 = uVar39;
                }
                else {
                  bVar48 = false;
                }
              }
            }
            puVar47 = puVar47 + 1;
            min_length = (size_t)(uVar20 & 0x80000000);
          } while (!bVar48);
          len1 = len1 + (long)local_2d8;
          if (len1 != 0) {
            if (len1 == 0x40) break;
            local_288 = (ulong)(src2[len1 - 0x41].length_and_code >> 5);
          }
          sVar28 = sVar28 + 1;
        } while (sVar28 != sVar17);
        MergeMatches(dst,dst + uVar11 * 0x100 + -0x40,len1,src2,len2);
        len2 = len2 + len1;
      }
      if (len2 == 0) {
        len2 = 0;
      }
      else if (uVar19 < dst[len2 - 1].length_and_code >> 5) {
        *dst = dst[len2 - 1];
        len2 = 1;
      }
      sVar17 = UpdateNodes(num_bytes,position,sVar22,ringbuffer,ringbuffer_mask,params,
                           max_backward_limit,dist_cache,len2,dst,self,&queue,nodes);
      uVar16 = 0;
      if (0x3fff < sVar17) {
        uVar16 = sVar17;
      }
      if (((len2 == 1) && (uVar20 = dst->length_and_code >> 5, uVar19 < uVar20)) &&
         (uVar16 < uVar20)) {
        uVar16 = (ulong)uVar20;
      }
      local_280 = sVar22;
      if (1 < uVar16) {
        uVar33 = uVar31 + 1;
        uVar23 = uVar16 + uVar31;
        if (lVar21 + position <= uVar16 + uVar31) {
          uVar23 = lVar21 + position;
        }
        uVar30 = uVar23 - 0x3f;
        if (uVar23 < uVar31 + 0x40) {
          uVar30 = uVar33;
        }
        if ((uVar31 + 0x201 <= uVar30) && (uVar33 < uVar30)) {
          uVar31 = (hasher->privat)._H5.bucket_size_;
          puVar4 = (hasher->privat)._H2.buckets_;
          pvVar5 = (hasher->privat)._H40.extra[1];
          do {
            puVar1 = ringbuffer + (uVar33 & ringbuffer_mask);
            uVar20 = (uint)(*(int *)(ringbuffer + (uVar33 & ringbuffer_mask)) * 0x1e35a7bd) >> 0xf;
            uVar39 = (ulong)puVar4[uVar20];
            uVar37 = (uVar31 & uVar33) * 2 + 1;
            uVar40 = (uVar31 & uVar33) * 2;
            puVar4[uVar20] = (uint32_t)uVar33;
            lVar15 = 0x40;
            local_2d8 = (uint8_t *)0x0;
            local_2f8 = (uint8_t *)0x0;
            do {
              if ((uVar33 == uVar39) || (lVar15 == 0 || uVar31 - 0xf < uVar33 - uVar39)) {
                iVar14 = (hasher->privat)._H5.hash_shift_;
                *(int *)((long)pvVar5 + uVar40 * 4) = iVar14;
                *(int *)((long)pvVar5 + uVar37 * 4) = iVar14;
                bVar48 = false;
              }
              else {
                puVar34 = local_2f8;
                if (local_2d8 < local_2f8) {
                  puVar34 = local_2d8;
                }
                puVar35 = (ulong *)(puVar1 + (long)puVar34);
                puVar42 = (ulong *)(ringbuffer + (uVar39 & ringbuffer_mask) + (long)puVar34);
                puVar36 = puVar1;
                puVar24 = puVar35;
                for (uVar38 = 0x80 - (long)puVar34; 7 < uVar38; uVar38 = uVar38 - 8) {
                  uVar32 = *puVar42;
                  uVar46 = *puVar24;
                  if (uVar32 == uVar46) {
                    puVar24 = puVar24 + 1;
                  }
                  else {
                    uVar43 = 0;
                    if ((uVar46 ^ uVar32) != 0) {
                      for (; ((uVar46 ^ uVar32) >> uVar43 & 1) == 0; uVar43 = uVar43 + 1) {
                      }
                    }
                    puVar36 = (uint8_t *)
                              ((long)puVar24 + ((uVar43 >> 3 & 0x1fffffff) - (long)puVar35));
                  }
                  if (uVar32 != uVar46) goto LAB_002eac2f;
                  puVar42 = puVar42 + 1;
                }
                puVar41 = puVar24;
                if (uVar38 != 0) {
                  puVar41 = (ulong *)((long)puVar24 + uVar38);
                  uVar32 = 0;
                  do {
                    if (*(char *)((long)puVar24 + uVar32) != *(char *)((long)puVar42 + uVar32)) {
                      puVar41 = (ulong *)((long)puVar24 + uVar32);
                      break;
                    }
                    uVar32 = uVar32 + 1;
                  } while (uVar38 != uVar32);
                }
                puVar36 = (uint8_t *)((long)puVar41 - (long)puVar35);
LAB_002eac2f:
                puVar36 = puVar36 + (long)puVar34;
                if (puVar36 < (uint8_t *)0x80) {
                  uVar38 = (uVar39 & uVar31) * 2;
                  if ((ringbuffer + (uVar39 & ringbuffer_mask))[(long)puVar36] <
                      puVar1[(long)puVar36]) {
                    *(int *)((long)pvVar5 + uVar40 * 4) = (int)uVar39;
                    uVar38 = uVar38 | 1;
                    uVar40 = uVar38;
                    local_2d8 = puVar36;
                  }
                  else {
                    *(int *)((long)pvVar5 + uVar37 * 4) = (int)uVar39;
                    uVar37 = uVar38;
                    local_2f8 = puVar36;
                  }
                  uVar39 = (ulong)*(uint *)((long)pvVar5 + uVar38 * 4);
                  bVar48 = true;
                }
                else {
                  *(undefined4 *)((long)pvVar5 + uVar40 * 4) =
                       *(undefined4 *)((long)pvVar5 + (uVar39 & uVar31) * 8);
                  *(undefined4 *)((long)pvVar5 + uVar37 * 4) =
                       *(undefined4 *)((long)pvVar5 + (uVar39 & uVar31) * 8 + 4);
                  bVar48 = false;
                }
              }
              lVar15 = lVar15 + -1;
            } while (bVar48);
            uVar33 = uVar33 + 8;
          } while (uVar33 < uVar30);
        }
        if (uVar30 < uVar23) {
          uVar31 = (hasher->privat)._H5.bucket_size_;
          puVar4 = (hasher->privat)._H2.buckets_;
          pvVar5 = (hasher->privat)._H40.extra[1];
          do {
            puVar1 = ringbuffer + (uVar30 & ringbuffer_mask);
            uVar20 = (uint)(*(int *)(ringbuffer + (uVar30 & ringbuffer_mask)) * 0x1e35a7bd) >> 0xf;
            uVar40 = (ulong)puVar4[uVar20];
            uVar33 = (uVar31 & uVar30) * 2 + 1;
            uVar37 = (uVar31 & uVar30) * 2;
            puVar4[uVar20] = (uint32_t)uVar30;
            lVar15 = 0x40;
            local_2c0 = (uint8_t *)0x0;
            local_2d8 = (uint8_t *)0x0;
            do {
              if ((uVar30 == uVar40) || (lVar15 == 0 || uVar31 - 0xf < uVar30 - uVar40)) {
                iVar14 = (hasher->privat)._H5.hash_shift_;
                *(int *)((long)pvVar5 + uVar37 * 4) = iVar14;
                *(int *)((long)pvVar5 + uVar33 * 4) = iVar14;
                bVar48 = false;
              }
              else {
                puVar34 = local_2d8;
                if (local_2c0 < local_2d8) {
                  puVar34 = local_2c0;
                }
                puVar35 = (ulong *)(puVar1 + (long)puVar34);
                puVar24 = (ulong *)(ringbuffer + (uVar40 & ringbuffer_mask) + (long)puVar34);
                puVar36 = puVar1;
                puVar42 = puVar35;
                for (uVar39 = 0x80 - (long)puVar34; 7 < uVar39; uVar39 = uVar39 - 8) {
                  uVar38 = *puVar24;
                  uVar32 = *puVar42;
                  if (uVar38 == uVar32) {
                    puVar42 = puVar42 + 1;
                  }
                  else {
                    uVar46 = 0;
                    if ((uVar32 ^ uVar38) != 0) {
                      for (; ((uVar32 ^ uVar38) >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
                      }
                    }
                    puVar36 = (uint8_t *)
                              ((long)puVar42 + ((uVar46 >> 3 & 0x1fffffff) - (long)puVar35));
                  }
                  if (uVar38 != uVar32) goto LAB_002eae37;
                  puVar24 = puVar24 + 1;
                }
                puVar41 = puVar42;
                if (uVar39 != 0) {
                  puVar41 = (ulong *)((long)puVar42 + uVar39);
                  uVar38 = 0;
                  do {
                    if (*(char *)((long)puVar42 + uVar38) != *(char *)((long)puVar24 + uVar38)) {
                      puVar41 = (ulong *)((long)puVar42 + uVar38);
                      break;
                    }
                    uVar38 = uVar38 + 1;
                  } while (uVar39 != uVar38);
                }
                puVar36 = (uint8_t *)((long)puVar41 - (long)puVar35);
LAB_002eae37:
                puVar36 = puVar36 + (long)puVar34;
                if (puVar36 < (uint8_t *)0x80) {
                  uVar39 = (uVar40 & uVar31) * 2;
                  if ((ringbuffer + (uVar40 & ringbuffer_mask))[(long)puVar36] <
                      puVar1[(long)puVar36]) {
                    *(int *)((long)pvVar5 + uVar37 * 4) = (int)uVar40;
                    uVar39 = uVar39 | 1;
                    uVar37 = uVar39;
                    local_2c0 = puVar36;
                  }
                  else {
                    *(int *)((long)pvVar5 + uVar33 * 4) = (int)uVar40;
                    uVar33 = uVar39;
                    local_2d8 = puVar36;
                  }
                  uVar40 = (ulong)*(uint *)((long)pvVar5 + uVar39 * 4);
                  bVar48 = true;
                }
                else {
                  *(undefined4 *)((long)pvVar5 + uVar37 * 4) =
                       *(undefined4 *)((long)pvVar5 + (uVar40 & uVar31) * 8);
                  *(undefined4 *)((long)pvVar5 + uVar33 * 4) =
                       *(undefined4 *)((long)pvVar5 + (uVar40 & uVar31) * 8 + 4);
                  bVar48 = false;
                }
              }
              lVar15 = lVar15 + -1;
            } while (bVar48);
            uVar30 = uVar30 + 1;
          } while (uVar30 < uVar23);
        }
        min_length = uVar16 - 1;
        if (min_length != 0) {
          uVar31 = sVar22 + 4;
          do {
            local_280 = uVar31 - 3;
            if (num_bytes <= uVar31) break;
            EvaluateNode(local_1e8,local_280,max_backward_limit,gap,dist_cache,self,&queue,nodes);
            uVar31 = uVar31 + 1;
            min_length = min_length - 1;
          } while (min_length != 0);
        }
      }
      sVar22 = local_280 + 1;
    } while (local_280 + 4 < num_bytes);
  }
  BrotliFree(m,self->literal_costs_);
  self->literal_costs_ = (float *)0x0;
  BrotliFree(m,self->cost_dist_);
  self->cost_dist_ = (float *)0x0;
  BrotliFree(m,self);
  BrotliFree(m,dst);
  sVar18 = ComputeShortestPathFromNodes(num_bytes,nodes);
  return sVar18;
}

Assistant:

size_t duckdb_brotli::BrotliZopfliComputeShortestPath(MemoryManager* m, size_t num_bytes,
    size_t position, const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    const int* dist_cache, Hasher* hasher, ZopfliNode* nodes) {
  const size_t stream_offset = params->stream_offset;
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t max_zopfli_len = MaxZopfliLen(params);
  StartPosQueue queue;
  BackwardMatch* BROTLI_RESTRICT matches =
      BROTLI_ALLOC(m, BackwardMatch, 2 * (MAX_NUM_MATCHES_H10 + 64));
  const size_t store_end = num_bytes >= StoreLookaheadH10() ?
      position + num_bytes - StoreLookaheadH10() + 1 : position;
  size_t i;
  const CompoundDictionary* addon = &params->dictionary.compound;
  size_t gap = addon->total_size;
  size_t lz_matches_offset =
      (addon->num_chunks != 0) ? (MAX_NUM_MATCHES_H10 + 128) : 0;
  ZopfliCostModel* model = BROTLI_ALLOC(m, ZopfliCostModel, 1);
  if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(model) || BROTLI_IS_NULL(matches)) {
    return 0;
  }
  nodes[0].length = 0;
  nodes[0].u.cost = 0;
  InitZopfliCostModel(m, model, &params->dist, num_bytes);
  if (BROTLI_IS_OOM(m)) return 0;
  ZopfliCostModelSetFromLiteralCosts(
      model, position, ringbuffer, ringbuffer_mask);
  InitStartPosQueue(&queue);
  for (i = 0; i + HashTypeLengthH10() - 1 < num_bytes; i++) {
    const size_t pos = position + i;
    const size_t max_distance = BROTLI_MIN(size_t, pos, max_backward_limit);
    const size_t dictionary_start = BROTLI_MIN(size_t,
        pos + stream_offset, max_backward_limit);
    size_t skip;
    size_t num_matches;
    int dict_id = 0;
    if (params->dictionary.contextual.context_based) {
      uint8_t p1 = pos >= 1 ?
          ringbuffer[(size_t)(pos - 1) & ringbuffer_mask] : 0;
      uint8_t p2 = pos >= 2 ?
          ringbuffer[(size_t)(pos - 2) & ringbuffer_mask] : 0;
      dict_id = params->dictionary.contextual.context_map[
          BROTLI_CONTEXT(p1, p2, literal_context_lut)];
    }
    num_matches = FindAllMatchesH10(&hasher->privat._H10,
        params->dictionary.contextual.dict[dict_id],
        ringbuffer, ringbuffer_mask, pos, num_bytes - i, max_distance,
        dictionary_start + gap, params, &matches[lz_matches_offset]);
    if (addon->num_chunks != 0) {
      size_t cd_matches = LookupAllCompoundDictionaryMatches(addon,
          ringbuffer, ringbuffer_mask, pos, 3, num_bytes - i,
          dictionary_start, params->dist.max_distance,
          &matches[lz_matches_offset - 64], 64);
      MergeMatches(matches, &matches[lz_matches_offset - 64], cd_matches,
          &matches[lz_matches_offset], num_matches);
      num_matches += cd_matches;
    }
    if (num_matches > 0 &&
        BackwardMatchLength(&matches[num_matches - 1]) > max_zopfli_len) {
      matches[0] = matches[num_matches - 1];
      num_matches = 1;
    }
    skip = UpdateNodes(num_bytes, position, i, ringbuffer, ringbuffer_mask,
        params, max_backward_limit, dist_cache, num_matches, matches, model,
        &queue, nodes);
    if (skip < BROTLI_LONG_COPY_QUICK_STEP) skip = 0;
    if (num_matches == 1 && BackwardMatchLength(&matches[0]) > max_zopfli_len) {
      skip = BROTLI_MAX(size_t, BackwardMatchLength(&matches[0]), skip);
    }
    if (skip > 1) {
      /* Add the tail of the copy to the hasher. */
      StoreRangeH10(&hasher->privat._H10,
          ringbuffer, ringbuffer_mask, pos + 1, BROTLI_MIN(
          size_t, pos + skip, store_end));
      skip--;
      while (skip) {
        i++;
        if (i + HashTypeLengthH10() - 1 >= num_bytes) break;
        EvaluateNode(position + stream_offset, i, max_backward_limit, gap,
            dist_cache, model, &queue, nodes);
        skip--;
      }
    }
  }
  CleanupZopfliCostModel(m, model);
  BROTLI_FREE(m, model);
  BROTLI_FREE(m, matches);
  return ComputeShortestPathFromNodes(num_bytes, nodes);
}